

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svc_layercontext.c
# Opt level: O2

void av1_set_svc_fixed_mode(AV1_COMP *cpi)

{
  uint uVar1;
  int iVar2;
  AV1_PRIMARY *pAVar3;
  long lVar4;
  
  pAVar3 = cpi->ppi;
  (pAVar3->rtc_ref).set_ref_frame_config = 1;
  uVar1 = (cpi->svc).current_superframe;
  for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
    (pAVar3->rtc_ref).reference[lVar4] = 0;
    (pAVar3->rtc_ref).ref_idx[lVar4] = (int)lVar4;
  }
  for (lVar4 = 0; lVar4 != 8; lVar4 = lVar4 + 1) {
    (pAVar3->rtc_ref).refresh[lVar4] = 0;
  }
  (pAVar3->rtc_ref).reference[0] = 1;
  if (0 < (cpi->svc).spatial_layer_id) {
    (pAVar3->rtc_ref).reference[3] = 1;
  }
  iVar2 = (cpi->svc).temporal_layer_id;
  if (iVar2 != 2) {
    if (iVar2 == 1) {
      iVar2 = (cpi->svc).spatial_layer_id;
      if (iVar2 == 0) {
        for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
          (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
        }
        if (((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) &&
           ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id)) {
          return;
        }
        (pAVar3->rtc_ref).ref_idx[3] = 5;
        (pAVar3->rtc_ref).refresh[5] = 1;
        return;
      }
      if (iVar2 != 1) {
        if (iVar2 != 2) {
          return;
        }
        for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
          (pAVar3->rtc_ref).ref_idx[lVar4] = 6;
        }
        (pAVar3->rtc_ref).ref_idx[0] = 2;
        if ((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) {
          return;
        }
        (pAVar3->rtc_ref).ref_idx[2] = 7;
        (pAVar3->rtc_ref).refresh[7] = 1;
        return;
      }
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 5;
      }
      (pAVar3->rtc_ref).ref_idx[0] = 1;
      if (((cpi->svc).number_temporal_layers + -1 <= (cpi->svc).temporal_layer_id) &&
         ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id)) {
        return;
      }
      (pAVar3->rtc_ref).ref_idx[2] = 6;
      (pAVar3->rtc_ref).refresh[6] = 1;
      return;
    }
    if (iVar2 != 0) {
      return;
    }
    iVar2 = (cpi->svc).spatial_layer_id;
    if (iVar2 == 0) {
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
      }
      (pAVar3->rtc_ref).refresh[0] = 1;
      return;
    }
    if (iVar2 == 1) {
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
      }
      (pAVar3->rtc_ref).ref_idx[0] = 1;
      (pAVar3->rtc_ref).refresh[1] = 1;
      return;
    }
    if (iVar2 != 2) {
      return;
    }
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      (pAVar3->rtc_ref).ref_idx[lVar4] = 1;
    }
    (pAVar3->rtc_ref).ref_idx[0] = 2;
    (pAVar3->rtc_ref).refresh[2] = 1;
    return;
  }
  if ((uVar1 - 1 & 3) == 0) {
    iVar2 = (cpi->svc).spatial_layer_id;
    if (iVar2 == 0) {
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
      }
      goto LAB_00213e62;
    }
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        return;
      }
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 4;
      }
      (pAVar3->rtc_ref).ref_idx[0] = 2;
      return;
    }
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      (pAVar3->rtc_ref).ref_idx[lVar4] = 3;
    }
    (pAVar3->rtc_ref).ref_idx[0] = 1;
  }
  else {
    if ((uVar1 + 1 & 3) != 0) {
      return;
    }
    iVar2 = (cpi->svc).spatial_layer_id;
    if (iVar2 == 0) {
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
      }
      (pAVar3->rtc_ref).ref_idx[0] = 5;
LAB_00213e62:
      if ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) {
        return;
      }
      (pAVar3->rtc_ref).ref_idx[3] = 3;
      (pAVar3->rtc_ref).refresh[3] = 1;
      return;
    }
    if (iVar2 != 1) {
      if (iVar2 != 2) {
        return;
      }
      for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
        (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
      }
      (pAVar3->rtc_ref).ref_idx[0] = 7;
      (pAVar3->rtc_ref).ref_idx[3] = 4;
      return;
    }
    for (lVar4 = 0; lVar4 != 7; lVar4 = lVar4 + 1) {
      (pAVar3->rtc_ref).ref_idx[lVar4] = 0;
    }
    (pAVar3->rtc_ref).ref_idx[0] = 6;
    (pAVar3->rtc_ref).ref_idx[3] = 3;
  }
  if ((cpi->svc).number_spatial_layers + -1 <= (cpi->svc).spatial_layer_id) {
    return;
  }
  (pAVar3->rtc_ref).ref_idx[1] = 4;
  (pAVar3->rtc_ref).refresh[4] = 1;
  return;
}

Assistant:

void av1_set_svc_fixed_mode(AV1_COMP *const cpi) {
  SVC *const svc = &cpi->svc;
  RTC_REF *const rtc_ref = &cpi->ppi->rtc_ref;
  int i;
  assert(svc->use_flexible_mode == 0);
  // Fixed SVC mode only supports at most 3 spatial or temporal layers.
  assert(svc->number_spatial_layers >= 1 && svc->number_spatial_layers <= 3 &&
         svc->number_temporal_layers >= 1 && svc->number_temporal_layers <= 3);
  rtc_ref->set_ref_frame_config = 1;
  int superframe_cnt = svc->current_superframe;
  // Set the reference map buffer idx for the 7 references:
  // LAST_FRAME (0), LAST2_FRAME(1), LAST3_FRAME(2), GOLDEN_FRAME(3),
  // BWDREF_FRAME(4), ALTREF2_FRAME(5), ALTREF_FRAME(6).
  for (i = 0; i < INTER_REFS_PER_FRAME; i++) {
    rtc_ref->reference[i] = 0;
    rtc_ref->ref_idx[i] = i;
  }
  for (i = 0; i < REF_FRAMES; i++) rtc_ref->refresh[i] = 0;
  // Always reference LAST, and reference GOLDEN on SL > 0.
  // For KSVC: GOLDEN reference will be removed on INTER_FRAMES later
  // when frame_type is set.
  rtc_ref->reference[SVC_LAST_FRAME] = 1;
  if (svc->spatial_layer_id > 0) rtc_ref->reference[SVC_GOLDEN_FRAME] = 1;
  if (svc->temporal_layer_id == 0) {
    // Base temporal layer.
    if (svc->spatial_layer_id == 0) {
      // Set all buffer_idx to 0. Update slot 0 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->refresh[0] = 1;
    } else if (svc->spatial_layer_id == 1) {
      // Set buffer_idx for LAST to slot 1, GOLDEN (and all other refs) to
      // slot 0. Update slot 1 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      rtc_ref->refresh[1] = 1;
    } else if (svc->spatial_layer_id == 2) {
      // Set buffer_idx for LAST to slot 2, GOLDEN (and all other refs) to
      // slot 1. Update slot 2 (LAST).
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 1;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
      rtc_ref->refresh[2] = 1;
    }
  } else if (svc->temporal_layer_id == 2 && (superframe_cnt - 1) % 4 == 0) {
    // First top temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Reference LAST (slot 0).
      // Set GOLDEN to slot 3 and update slot 3.
      // Set all other buffer_idx to slot 0.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
        rtc_ref->refresh[3] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1,
      // GOLDEN (and all other refs) to slot 3.
      // Set LAST2 to slot 4 and Update slot 4.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 3;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST2_FRAME] = 4;
        rtc_ref->refresh[4] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2,
      // GOLDEN (and all other refs) to slot 4.
      // No update.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 4;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
    }
  } else if (svc->temporal_layer_id == 1) {
    // Middle temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Reference LAST.
      // Set all buffer_idx to 0.
      // Set GOLDEN to slot 5 and update slot 5.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1 ||
          svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 5;
        rtc_ref->refresh[5] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 1,
      // GOLDEN (and all other refs) to slot 5.
      // Set LAST3 to slot 6 and update slot 6.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 5;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 1;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1 ||
          svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST3_FRAME] = 6;
        rtc_ref->refresh[6] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 2,
      // GOLDEN (and all other refs) to slot 6.
      // Set LAST3 to slot 7 and update slot 7.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 6;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 2;
      if (svc->temporal_layer_id < svc->number_temporal_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST3_FRAME] = 7;
        rtc_ref->refresh[7] = 1;
      }
    }
  } else if (svc->temporal_layer_id == 2 && (superframe_cnt - 3) % 4 == 0) {
    // Second top temporal enhancement layer.
    if (svc->spatial_layer_id == 0) {
      // Set LAST to slot 5 and reference LAST.
      // Set GOLDEN to slot 3 and update slot 3.
      // Set all other buffer_idx to 0.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 5;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
        rtc_ref->refresh[3] = 1;
      }
    } else if (svc->spatial_layer_id == 1) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 6,
      // GOLDEN to slot 3. Set LAST2 to slot 4 and update slot 4.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 6;
      rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 3;
      if (svc->spatial_layer_id < svc->number_spatial_layers - 1) {
        rtc_ref->ref_idx[SVC_LAST2_FRAME] = 4;
        rtc_ref->refresh[4] = 1;
      }
    } else if (svc->spatial_layer_id == 2) {
      // Reference LAST and GOLDEN. Set buffer_idx for LAST to slot 7,
      // GOLDEN to slot 4. No update.
      for (i = 0; i < INTER_REFS_PER_FRAME; i++) rtc_ref->ref_idx[i] = 0;
      rtc_ref->ref_idx[SVC_LAST_FRAME] = 7;
      rtc_ref->ref_idx[SVC_GOLDEN_FRAME] = 4;
    }
  }
}